

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall DLevelScript::CheckActorProperty(DLevelScript *this,int tid,int property,int value)

{
  undefined8 __s1;
  DWORD DVar1;
  uint uVar2;
  int iVar3;
  AActor *defactor;
  char *__s2;
  undefined1 local_3c [12];
  char *string;
  AActor *actor;
  int local_20;
  int value_local;
  int property_local;
  int tid_local;
  DLevelScript *this_local;
  
  actor._4_4_ = value;
  local_20 = property;
  value_local = tid;
  _property_local = this;
  defactor = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->activator);
  string = (char *)SingleActorFromTID(tid,defactor);
  local_3c._4_8_ = 0;
  if ((AActor *)string != (AActor *)0x0) {
    switch(local_20) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 0xc:
    case 0xf:
    case 0x11:
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2d:
      DVar1 = GetActorProperty(this,value_local,local_20);
      return (uint)(DVar1 == actor._4_4_);
    case 5:
      local_3c._4_8_ =
           FSoundID::operator_cast_to_char_(&(((AActor *)string)->SeeSound).super_FSoundID);
      break;
    case 6:
      local_3c._4_8_ =
           FSoundID::operator_cast_to_char_(&(((AActor *)string)->AttackSound).super_FSoundID);
      break;
    case 7:
      local_3c._4_8_ =
           FSoundID::operator_cast_to_char_(&(((AActor *)string)->PainSound).super_FSoundID);
      break;
    case 8:
      local_3c._4_8_ =
           FSoundID::operator_cast_to_char_(&(((AActor *)string)->DeathSound).super_FSoundID);
      break;
    case 9:
      local_3c._4_8_ =
           FSoundID::operator_cast_to_char_(&(((AActor *)string)->ActiveSound).super_FSoundID);
      break;
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x12:
    case 0x13:
    case 0x17:
    case 0x1f:
      uVar2 = GetActorProperty(this,value_local,local_20);
      return (uint)(uVar2 == (actor._4_4_ != 0));
    case 0x14:
      AActor::GetSpecies((AActor *)local_3c);
      local_3c._4_8_ = FName::operator_cast_to_char_((FName *)local_3c);
      break;
    case 0x15:
      local_3c._4_8_ = AActor::GetTag((AActor *)string,(char *)0x0);
      break;
    default:
      return 0;
    case 0x2e:
      local_3c._4_8_ = FName::operator_cast_to_char_(&(((AActor *)string)->DamageType).super_FName);
    }
    if ((char *)local_3c._4_8_ == (char *)0x0) {
      local_3c._4_8_ = "";
    }
    __s1 = local_3c._4_8_;
    __s2 = FBehavior::StaticLookupString(actor._4_4_);
    iVar3 = strcasecmp((char *)__s1,__s2);
    return (uint)((iVar3 != 0 ^ 0xffU) & 1);
  }
  return 0;
}

Assistant:

int DLevelScript::CheckActorProperty (int tid, int property, int value)
{
	AActor *actor = SingleActorFromTID (tid, activator);
	const char *string = NULL;
	if (actor == NULL)
	{
		return 0;
	}
	switch (property)
	{
		// Default
		default:				return 0;

		// Straightforward integer values:
		case APROP_Health:
		case APROP_Speed:
		case APROP_Damage:
		case APROP_DamageFactor:
		case APROP_Alpha:
		case APROP_RenderStyle:
		case APROP_Gravity:
		case APROP_SpawnHealth:
		case APROP_JumpZ:
		case APROP_Score:
		case APROP_MasterTID:
		case APROP_TargetTID:
		case APROP_TracerTID:
		case APROP_WaterLevel:
		case APROP_ScaleX:
		case APROP_ScaleY:
		case APROP_Mass:
		case APROP_Accuracy:
		case APROP_Stamina:
		case APROP_Height:
		case APROP_Radius:
		case APROP_ReactionTime:
		case APROP_MeleeRange:
		case APROP_ViewHeight:
		case APROP_AttackZOffset:
		case APROP_MaxStepHeight:
		case APROP_MaxDropOffHeight:
		case APROP_StencilColor:
			return (GetActorProperty(tid, property) == value);

		// Boolean values need to compare to a binary version of value
		case APROP_Ambush:
		case APROP_Invulnerable:
		case APROP_Dropped:
		case APROP_ChaseGoal:
		case APROP_Frightened:
		case APROP_Friendly:
		case APROP_Notarget:
		case APROP_Notrigger:
		case APROP_Dormant:
			return (GetActorProperty(tid, property) == (!!value));

		// Strings are covered by GetActorProperty, but they're fairly
		// heavy-duty, so make the check here.
		case APROP_SeeSound:	string = actor->SeeSound; break;
		case APROP_AttackSound:	string = actor->AttackSound; break;
		case APROP_PainSound:	string = actor->PainSound; break;
		case APROP_DeathSound:	string = actor->DeathSound; break;
		case APROP_ActiveSound:	string = actor->ActiveSound; break; 
		case APROP_Species:		string = actor->GetSpecies(); break;
		case APROP_NameTag:		string = actor->GetTag(); break;
		case APROP_DamageType:	string = actor->DamageType; break;
	}
	if (string == NULL) string = "";
	return (!stricmp(string, FBehavior::StaticLookupString(value)));
}